

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_comparison.cpp
# Opt level: O2

FilterPropagateResult __thiscall
duckdb::StatisticsPropagator::PropagateComparison
          (StatisticsPropagator *this,BaseStatistics *lstats,BaseStatistics *rstats,
          ExpressionType comparison)

{
  PhysicalType PVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  FilterPropagateResult FVar5;
  Value local_120;
  Value local_e0;
  Value local_a0;
  Value local_60;
  
  PVar1 = (lstats->type).physical_type_;
  if ((((0xc < PVar1) || ((0x1bfeU >> (PVar1 & 0x1f) & 1) == 0)) && (1 < PVar1 - 0xcb)) ||
     ((bVar2 = NumericStats::HasMinMax(lstats), !bVar2 ||
      (bVar2 = NumericStats::HasMinMax(rstats), !bVar2)))) {
    return NO_PRUNING_POSSIBLE;
  }
  bVar2 = BaseStatistics::CanHaveNull(lstats);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = BaseStatistics::CanHaveNull(rstats);
  }
  FVar5 = NO_PRUNING_POSSIBLE;
  switch(comparison) {
  case COMPARE_BOUNDARY_START:
    NumericStats::Min(&local_e0,lstats);
    NumericStats::Max(&local_120,rstats);
    bVar4 = Value::operator>(&local_e0,&local_120);
    bVar2 = true;
    if (!bVar4) {
      NumericStats::Min(&local_60,rstats);
      NumericStats::Max(&local_a0,lstats);
      bVar2 = Value::operator>(&local_60,&local_a0);
      Value::~Value(&local_a0);
      Value::~Value(&local_60);
    }
    break;
  default:
    goto switchD_01a79168_caseD_1a;
  case COMPARE_LESSTHAN:
    NumericStats::Max(&local_e0,lstats);
    NumericStats::Min(&local_120,rstats);
    bVar2 = Value::operator<(&local_e0,&local_120);
    Value::~Value(&local_120);
    Value::~Value(&local_e0);
    if (bVar2) {
LAB_01a793b1:
      return bVar3 * '\x02' + FILTER_ALWAYS_TRUE;
    }
    NumericStats::Min(&local_e0,lstats);
    NumericStats::Max(&local_120,rstats);
    bVar2 = Value::operator>=(&local_e0,&local_120);
    break;
  case COMPARE_GREATERTHAN:
    NumericStats::Min(&local_e0,lstats);
    NumericStats::Max(&local_120,rstats);
    bVar2 = Value::operator>(&local_e0,&local_120);
    Value::~Value(&local_120);
    Value::~Value(&local_e0);
    if (bVar2) goto LAB_01a793b1;
    NumericStats::Min(&local_e0,rstats);
    NumericStats::Max(&local_120,lstats);
    bVar2 = Value::operator>=(&local_e0,&local_120);
    break;
  case COMPARE_LESSTHANOREQUALTO:
    NumericStats::Max(&local_e0,lstats);
    NumericStats::Min(&local_120,rstats);
    bVar2 = Value::operator<=(&local_e0,&local_120);
    Value::~Value(&local_120);
    Value::~Value(&local_e0);
    if (bVar2) goto LAB_01a793b1;
    NumericStats::Min(&local_e0,lstats);
    NumericStats::Max(&local_120,rstats);
    bVar2 = Value::operator>(&local_e0,&local_120);
    break;
  case COMPARE_GREATERTHANOREQUALTO:
    NumericStats::Min(&local_e0,lstats);
    NumericStats::Max(&local_120,rstats);
    bVar2 = Value::operator>=(&local_e0,&local_120);
    Value::~Value(&local_120);
    Value::~Value(&local_e0);
    if (bVar2) goto LAB_01a793b1;
    NumericStats::Min(&local_e0,rstats);
    NumericStats::Max(&local_120,lstats);
    bVar2 = Value::operator>(&local_e0,&local_120);
  }
  Value::~Value(&local_120);
  Value::~Value(&local_e0);
  FVar5 = NO_PRUNING_POSSIBLE;
  if (bVar2 != false) {
    FVar5 = bVar3 * '\x02' + FILTER_ALWAYS_FALSE;
  }
switchD_01a79168_caseD_1a:
  return FVar5;
}

Assistant:

FilterPropagateResult StatisticsPropagator::PropagateComparison(BaseStatistics &lstats, BaseStatistics &rstats,
                                                                ExpressionType comparison) {
	// only handle numerics for now
	switch (lstats.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		break;
	default:
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
	if (!NumericStats::HasMinMax(lstats) || !NumericStats::HasMinMax(rstats)) {
		// no stats available: nothing to prune
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
	// the result of the propagation depend on whether or not either side has null values
	// if there are null values present, we cannot say whether or not
	bool has_null = lstats.CanHaveNull() || rstats.CanHaveNull();
	switch (comparison) {
	case ExpressionType::COMPARE_EQUAL:
		// l = r, if l.min > r.max or r.min > l.max equality is not possible
		if (NumericStats::Min(lstats) > NumericStats::Max(rstats) ||
		    NumericStats::Min(rstats) > NumericStats::Max(lstats)) {
			return has_null ? FilterPropagateResult::FILTER_FALSE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_FALSE;
		} else {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
	case ExpressionType::COMPARE_GREATERTHAN:
		// l > r
		if (NumericStats::Min(lstats) > NumericStats::Max(rstats)) {
			// if l.min > r.max, it is always true ONLY if neither side contains nulls
			return has_null ? FilterPropagateResult::FILTER_TRUE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		// if r.min is bigger or equal to l.max, the filter is always false
		if (NumericStats::Min(rstats) >= NumericStats::Max(lstats)) {
			return has_null ? FilterPropagateResult::FILTER_FALSE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// l >= r
		if (NumericStats::Min(lstats) >= NumericStats::Max(rstats)) {
			// if l.min >= r.max, it is always true ONLY if neither side contains nulls
			return has_null ? FilterPropagateResult::FILTER_TRUE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		// if r.min > l.max, the filter is always false
		if (NumericStats::Min(rstats) > NumericStats::Max(lstats)) {
			return has_null ? FilterPropagateResult::FILTER_FALSE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_LESSTHAN:
		// l < r
		if (NumericStats::Max(lstats) < NumericStats::Min(rstats)) {
			// if l.max < r.min, it is always true ONLY if neither side contains nulls
			return has_null ? FilterPropagateResult::FILTER_TRUE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		// if l.min >= rstats.max, the filter is always false
		if (NumericStats::Min(lstats) >= NumericStats::Max(rstats)) {
			return has_null ? FilterPropagateResult::FILTER_FALSE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// l <= r
		if (NumericStats::Max(lstats) <= NumericStats::Min(rstats)) {
			// if l.max <= r.min, it is always true ONLY if neither side contains nulls
			return has_null ? FilterPropagateResult::FILTER_TRUE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		// if l.min > rstats.max, the filter is always false
		if (NumericStats::Min(lstats) > NumericStats::Max(rstats)) {
			return has_null ? FilterPropagateResult::FILTER_FALSE_OR_NULL : FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	default:
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
}